

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<wasm::Ok> *
wasm::WATParser::block<wasm::WATParser::ParseDefsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,bool folded)

{
  Lexer *this;
  size_t sVar1;
  optional<wasm::Name> label_00;
  bool bVar2;
  undefined7 in_register_00000009;
  string *this_00;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  undefined1 local_138 [8];
  Result<wasm::HeapType> type;
  string local_f0;
  string local_d0;
  undefined1 auStack_b0 [8];
  optional<wasm::Name> label;
  undefined1 local_88 [8];
  optional<wasm::Name> id;
  undefined1 local_68 [8];
  Result<wasm::HeapType> _val;
  allocator<char> local_31;
  
  this = &ctx->in;
  sVar1 = (ctx->in).pos;
  label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._16_8_ = annotations;
  if ((int)CONCAT71(in_register_00000009,folded) == 0) {
    expected_00._M_str = "block";
    expected_00._M_len = 5;
    bVar2 = Lexer::takeKeyword(this,expected_00);
  }
  else {
    expected._M_str = "block";
    expected._M_len = 5;
    bVar2 = Lexer::takeSExprStart(this,expected);
  }
  if (bVar2 == false) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
    return __return_storage_ptr__;
  }
  _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
  super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
  super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
  super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
  super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
  super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._32_8_ = this;
  Lexer::takeID((optional<wasm::Name> *)auStack_b0,this);
  blocktype<wasm::WATParser::ParseDefsCtx>((Result<wasm::HeapType> *)local_138,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::HeapType,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::HeapType,_wasm::Err> *)local_68,
             (_Copy_ctor_base<false,_wasm::HeapType,_wasm::Err> *)local_138);
  if (_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__cxx11::string::string((string *)local_88,(string *)local_68);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               local_88);
    std::__cxx11::string::~string((string *)local_88);
    std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::HeapType,_wasm::Err> *)local_68);
    goto LAB_00c6ed89;
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::HeapType,_wasm::Err> *)local_68);
  label_00.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._17_7_ =
       label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Name>._M_payload._9_7_;
  label_00.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._M_engaged =
       (bool)label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._M_payload._8_1_;
  label_00.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_str =
       (char *)label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len
  ;
  label_00.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len =
       (size_t)auStack_b0;
  ParseDefsCtx::makeBlock
            ((Result<wasm::Ok> *)local_68,ctx,(Index)sVar1,
             (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *)
             label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._16_8_,label_00,(HeapType)local_138);
  if (_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__cxx11::string::string((string *)local_88,(string *)local_68);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               local_88);
LAB_00c6ed77:
    std::__cxx11::string::~string((string *)local_88);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_68);
    instrs<wasm::WATParser::ParseDefsCtx>((Result<wasm::Ok> *)local_68,ctx);
    if (_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string((string *)local_88,(string *)local_68);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                 local_88);
      goto LAB_00c6ed77;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_68);
    if (!folded) {
      expected_01._M_str = "end";
      expected_01._M_len = 3;
      bVar2 = Lexer::takeKeyword((Lexer *)_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                                          super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                                          super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                                          super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                                          super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                                          super__Variant_storage_alias<wasm::HeapType,_wasm::Err>.
                                          _32_8_,expected_01);
      if (bVar2) {
        Lexer::takeID((optional<wasm::Name> *)local_88,
                      (Lexer *)_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                               super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                               super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                               super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                               super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._32_8_);
        if ((id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._M_payload._8_1_ != '\x01') ||
           ((label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\x01' &&
            (id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len
             == label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                _M_len)))) goto LAB_00c6eea2;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"end label does not match block label",&local_31);
        Lexer::err((Err *)local_68,
                   (Lexer *)_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                            super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                            super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                            super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                            super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._32_8_,&local_d0
                  );
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   local_68);
        std::__cxx11::string::~string((string *)local_68);
        this_00 = &local_d0;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"expected \'end\' at end of block",
                   (allocator<char> *)local_88);
        Lexer::err((Err *)local_68,
                   (Lexer *)_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                            super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                            super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                            super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                            super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._32_8_,&local_f0
                  );
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   local_68);
        std::__cxx11::string::~string((string *)local_68);
        this_00 = &local_f0;
      }
LAB_00c6ef06:
      std::__cxx11::string::~string((string *)this_00);
      goto LAB_00c6ed89;
    }
    bVar2 = Lexer::takeRParen((Lexer *)_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                                       super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::HeapType,_wasm::Err>.
                                       _32_8_);
    if (!bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                         super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                         super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                         super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20),
                 "expected \')\' at end of block",(allocator<char> *)local_88);
      Lexer::err((Err *)local_68,
                 (Lexer *)_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                          super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                          super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                          super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                          super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._32_8_,
                 (string *)
                 ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                         super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                         super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                         super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                 local_68);
      std::__cxx11::string::~string((string *)local_68);
      this_00 = (string *)
                ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20);
      goto LAB_00c6ef06;
    }
LAB_00c6eea2:
    ParseDefsCtx::visitEnd((Result<wasm::Ok> *)local_68,ctx);
    MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>
              (__return_storage_ptr__,(Result<wasm::Ok> *)local_68);
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_68);
LAB_00c6ed89:
  std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::HeapType,_wasm::Err> *)local_138);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<>
block(Ctx& ctx, const std::vector<Annotation>& annotations, bool folded) {
  auto pos = ctx.in.getPos();

  if ((folded && !ctx.in.takeSExprStart("block"sv)) ||
      (!folded && !ctx.in.takeKeyword("block"sv))) {
    return {};
  }

  auto label = ctx.in.takeID();

  auto type = blocktype(ctx);
  CHECK_ERR(type);

  CHECK_ERR(ctx.makeBlock(pos, annotations, label, *type));

  CHECK_ERR(instrs(ctx));

  if (folded) {
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected ')' at end of block");
    }
  } else {
    if (!ctx.in.takeKeyword("end"sv)) {
      return ctx.in.err("expected 'end' at end of block");
    }
    auto id = ctx.in.takeID();
    if (id && id != label) {
      return ctx.in.err("end label does not match block label");
    }
  }

  return ctx.visitEnd();
}